

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::Context::Context(Context *this,Context *other)

{
  Context *pCVar1;
  Disposer *pDVar2;
  Context *this_00;
  String *in_RDX;
  
  this->file = other->file;
  this->line = other->line;
  str<kj::String_const&>(&this->description,(kj *)&other->description,in_RDX);
  (this->next).ptr.disposer = (Disposer *)0x0;
  (this->next).ptr.ptr = (Context *)0x0;
  pCVar1 = (other->next).ptr.ptr;
  if (pCVar1 != (Context *)0x0) {
    this_00 = (Context *)operator_new(0x38);
    Context(this_00,pCVar1);
    pDVar2 = (this->next).ptr.disposer;
    pCVar1 = (this->next).ptr.ptr;
    (this->next).ptr.disposer = (Disposer *)&kj::_::HeapDisposer<kj::Exception::Context>::instance;
    (this->next).ptr.ptr = this_00;
    if (pCVar1 != (Context *)0x0) {
      (**pDVar2->_vptr_Disposer)();
    }
  }
  return;
}

Assistant:

Exception::Context::Context(const Context& other) noexcept
    : file(other.file), line(other.line), description(str(other.description)) {
  KJ_IF_SOME(n, other.next) {
    next = heap(*n);
  }
}